

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_passphrase.c
# Opt level: O3

void test_archive_write_set_passphrase_callback(void)

{
  int iVar1;
  archive_write *a;
  char *pcVar2;
  int cnt;
  int local_34;
  
  a = (archive_write *)archive_write_new();
  local_34 = 0;
  archive_write_set_format_zip((archive *)a);
  iVar1 = archive_write_set_passphrase_callback((archive *)a,&local_34,callback1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_passphrase.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_passphrase_callback(a, &cnt, callback1)",(void *)0x0);
  pcVar2 = __archive_write_get_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_passphrase.c"
             ,L'W',"passCallBack","\"passCallBack\"",pcVar2,"__archive_write_get_passphrase(aw)",
             (void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_passphrase.c"
                      ,L'X',1,"1",(long)local_34,"cnt",(void *)0x0);
  pcVar2 = __archive_write_get_passphrase(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_passphrase.c"
             ,L'Z',"passCallBack","\"passCallBack\"",pcVar2,"__archive_write_get_passphrase(aw)",
             (void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_archive_write_set_passphrase.c"
                      ,L'[',1,"1",(long)local_34,"cnt",(void *)0x0);
  archive_write_free((archive *)a);
  return;
}

Assistant:

DEFINE_TEST(test_archive_write_set_passphrase_callback)
{
	struct archive* a = archive_write_new();
	struct archive_write* aw = (struct archive_write *)a;
	int cnt = 0;

	archive_write_set_format_zip(a);

	assertEqualInt(ARCHIVE_OK,
	    archive_write_set_passphrase_callback(a, &cnt, callback1));
	/* Check a passphrase. */
	assertEqualString("passCallBack", __archive_write_get_passphrase(aw));
	assertEqualInt(1, cnt);
	/* Callback function should be called just once. */
	assertEqualString("passCallBack", __archive_write_get_passphrase(aw));
	assertEqualInt(1, cnt);

	archive_write_free(a);
}